

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  RDL_DimacsGraph *dimacs_graph;
  undefined8 uVar3;
  RDL_data *URFdata;
  uint uVar4;
  size_t sVar5;
  char *__format;
  char *pcVar6;
  ulong uVar7;
  int basis_validation_result;
  int timeout;
  int urf_validation_result;
  int local_34;
  int local_30;
  int local_2c;
  
  local_30 = -1;
  if (argc < 2) {
    main_cold_8();
    return 1;
  }
  pcVar6 = argv[1];
  iVar2 = strcmp(pcVar6,"demo");
  if (iVar2 == 0) {
    if (argc == 2) {
      main_cold_7();
      return 1;
    }
  }
  else {
    iVar2 = strcmp(pcVar6,"validate");
    if (iVar2 != 0) {
      __format = "invalid mode \'%s\', allowed are \'demo\' and \'validate\'\n";
      goto LAB_0010279e;
    }
    if (argc == 2) {
      main_cold_2();
      return 1;
    }
    if ((3 < (uint)argc) && (iVar2 = __isoc99_sscanf(argv[3],"%d",&local_30), iVar2 == 0)) {
      main_cold_1();
      return 1;
    }
  }
  pcVar1 = argv[2];
  dimacs_graph = (RDL_DimacsGraph *)RDL_dimacsGraph_read(pcVar1);
  if (dimacs_graph == (RDL_DimacsGraph *)0x0) {
    __format = "unable to read file \'%s\'\n";
    pcVar6 = pcVar1;
LAB_0010279e:
    fprintf(_stderr,__format,pcVar6);
    return 1;
  }
  uVar3 = RDL_initNewGraph(dimacs_graph->nof_nodes);
  if (dimacs_graph->nof_edges != 0) {
    uVar7 = 0;
    do {
      RDL_addUEdge(uVar3,dimacs_graph->edges[uVar7][0] - 1,dimacs_graph->edges[uVar7][1] - 1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < dimacs_graph->nof_edges);
  }
  RDL_setOutputFunction(RDL_writeToStderr);
  URFdata = (RDL_data *)RDL_calculate(uVar3);
  if (URFdata == (RDL_data *)0x0) {
    main_cold_6();
    return 1;
  }
  iVar2 = strcmp(pcVar6,"demo");
  if (iVar2 == 0) {
    RDL_demo_output(URFdata);
    uVar4 = 0;
    goto LAB_00102755;
  }
  iVar2 = strcmp(pcVar6,"validate");
  uVar4 = 1;
  if (iVar2 != 0) goto LAB_00102755;
  RDL_validate(URFdata,dimacs_graph,local_30,&local_2c,&local_34);
  if (local_2c == -2) {
    pcVar6 = "URF validation ran out of memory!\n";
    sVar5 = 0x22;
LAB_001026c0:
    fwrite(pcVar6,sVar5,1,_stdout);
  }
  else {
    if (local_2c == 0) {
      pcVar6 = "URF validation successful!\n";
      sVar5 = 0x1b;
      goto LAB_001026c0;
    }
    if (local_2c == -1) {
      pcVar6 = "URF validation timed out!\n";
      sVar5 = 0x1a;
      goto LAB_001026c0;
    }
    main_cold_3();
  }
  if (local_34 == 0) {
    pcVar6 = "MCB validation successful!\n";
    sVar5 = 0x1b;
LAB_00102709:
    fwrite(pcVar6,sVar5,1,_stdout);
  }
  else {
    if (local_34 == -1) {
      pcVar6 = "MCB validation timed out!\n";
      sVar5 = 0x1a;
      goto LAB_00102709;
    }
    main_cold_4();
  }
  iVar2 = RDL_checkConsistency(URFdata);
  if (iVar2 == 0) {
    fwrite("consistency validation successful!\n",0x23,1,_stdout);
  }
  else {
    main_cold_5();
  }
  uVar4 = (uint)((local_2c != 0 || iVar2 != 0) || local_34 != 0);
LAB_00102755:
  RDL_deleteData(URFdata);
  RDL_dimacsGraph_delete(dimacs_graph);
  return uVar4;
}

Assistant:

int main(int argc, char **argv)
{
  const char* filename;
  RDL_graph *graph;
  RDL_data *data;
  const char* mode;
  unsigned idx;
  int timeout = -1, urf_validation_result, basis_validation_result, consistency_result;
  int return_code;

  if (argc < 2) {
    fprintf(stderr, "usage: %s mode filename [timeout=-1]\nwith mode 'demo' "
        "for demo output of URF calculations\n"
        "or\nwith mode 'validate' for testing/validation\n", argv[0]);
    return EXIT_FAILURE;
  }

  mode = argv[1];

  if (!strcmp(mode, "demo")) {
    if (argc < 3) {
      fprintf(stderr, "usage: %s demo filename\n", argv[0]);
      return EXIT_FAILURE;
    }
  }
  else if (!strcmp(mode, "validate")) {
    if (argc < 3) {
      fprintf(stderr, "usage: %s demo filename [timeout=-1]\n"
          "with timeout is validation timeout in seconds, default -1 (no timeout)\n", argv[0]);
      return EXIT_FAILURE;
    }
    if (argc > 3) {
      if (!sscanf(argv[3], "%d", &timeout)) {
        fprintf(stderr, "invalid timeout in seconds: '%s'\n", argv[3]);
        return EXIT_FAILURE;
      }
    }
  }
  else {
    fprintf(stderr, "invalid mode '%s', allowed are 'demo' and 'validate'\n", mode);
    return EXIT_FAILURE;
  }

  filename = argv[2];

  RDL_DimacsGraph* dimacs_graph = RDL_dimacsGraph_read(filename);

  if (!dimacs_graph) {
    fprintf(stderr, "unable to read file '%s'\n", filename);
    return EXIT_FAILURE;
  }

  graph = RDL_initNewGraph(dimacs_graph->nof_nodes);

  for (idx = 0; idx < dimacs_graph->nof_edges; ++idx) {
    RDL_addUEdge(graph, dimacs_graph->edges[idx][0]-1, dimacs_graph->edges[idx][1]-1);
  }

  RDL_setOutputFunction(RDL_writeToStderr);
  /* calculate Unique Ring Families */
  data = RDL_calculate(graph);
  if (!data) {
    fprintf(stderr, "Calculation failed!\n");
    RDL_deleteGraph(graph);
    RDL_dimacsGraph_delete(dimacs_graph);
    return EXIT_FAILURE;
  }

  if (!strcmp(mode, "demo")) {
    RDL_demo_output(data);
    return_code = EXIT_SUCCESS;
  }
  else if (!strcmp(mode, "validate")) {
    RDL_validate(data, dimacs_graph, timeout,
        &urf_validation_result, &basis_validation_result);
    if (urf_validation_result == -1) {
      fprintf(stdout, "URF validation timed out!\n");
    }
    else if (urf_validation_result == -2) {
      fprintf(stdout, "URF validation ran out of memory!\n");
    }
    else if (urf_validation_result == 0) {
      fprintf(stdout, "URF validation successful!\n");
    }
    else {
      fprintf(stderr, "URF validation failed!\n");
    }

    if (basis_validation_result == -1) {
      fprintf(stdout, "MCB validation timed out!\n");
    }
    else if (basis_validation_result == 0) {
      fprintf(stdout, "MCB validation successful!\n");
    }
    else {
      fprintf(stderr, "MCB validation failed!\n");
    }

    consistency_result = RDL_checkConsistency(data);
    if (consistency_result == 0) {
      fprintf(stdout, "consistency validation successful!\n");
    }
    else {
      fprintf(stderr, "consistency validation failed!\n");
    }

    if (urf_validation_result || consistency_result
        || basis_validation_result) {
      return_code = EXIT_FAILURE;
    }
    else {
      return_code = EXIT_SUCCESS;
    }
  }
  else {
    return_code = EXIT_FAILURE;
  }

  /* delete URFdata and the graph */
  RDL_deleteData(data);
  RDL_dimacsGraph_delete(dimacs_graph);

  return return_code;
}